

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

TestCaseGroup * __thiscall deqp::gls::fboc::details::Context::createRenderableTests(Context *this)

{
  GLenum GVar1;
  char *name;
  char *description;
  TestNode *pTVar2;
  TestNode *this_00;
  TestNode *this_01;
  TestNode *this_02;
  ParamTest<deqp::gls::fboc::details::RenderableParams> *pPVar3;
  _Base_ptr p_Var4;
  _Self __tmp_1;
  _Self __tmp;
  RenderableParams params;
  Formats texFmts;
  Formats rboFmts;
  AttPoint *local_c0;
  Params local_a8;
  TestNode *local_98;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_90;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_60;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,this->m_testCtx,"renderable",
             "Tests for support of renderable image formats");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,this->m_testCtx,"renderbuffer",
             "Tests for renderbuffer formats");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_01,this->m_testCtx,"texture","Tests for texture formats");
  FboUtil::FormatDB::getFormats((Formats *)&local_60,&this->m_allFormats,ANY_FORMAT);
  FboUtil::FormatDB::getFormats((Formats *)&local_90,&this->m_allFormats,ANY_FORMAT);
  local_c0 = createRenderableTests::attPoints;
  local_98 = pTVar2;
  do {
    pTVar2 = (TestNode *)operator_new(0x70);
    name = local_c0->name;
    description = local_c0->desc;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,this->m_testCtx,name,description);
    this_02 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_02,this->m_testCtx,name,description);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      GVar1 = local_c0->attPoint;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_a8.bufType = 0x8d41;
        local_a8.format.format = p_Var4[1]._M_color;
        local_a8.format.unsizedType = *(GLenum *)&p_Var4[1].field_0x4;
        local_a8.attPoint = GVar1;
        pPVar3 = (ParamTest<deqp::gls::fboc::details::RenderableParams> *)operator_new(0x88);
        ParamTest<deqp::gls::fboc::details::RenderableParams>::ParamTest(pPVar3,this,&local_a8);
        (pPVar3->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TestCase_00d2b0f0;
        tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header);
    }
    tcu::TestNode::addChild(this_00,pTVar2);
    pTVar2 = local_98;
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_90._M_impl.super__Rb_tree_header) {
      GVar1 = local_c0->attPoint;
      p_Var4 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_a8.bufType = 0x1702;
        local_a8.format.format = p_Var4[1]._M_color;
        local_a8.format.unsizedType = *(GLenum *)&p_Var4[1].field_0x4;
        local_a8.attPoint = GVar1;
        pPVar3 = (ParamTest<deqp::gls::fboc::details::RenderableParams> *)operator_new(0x88);
        ParamTest<deqp::gls::fboc::details::RenderableParams>::ParamTest(pPVar3,this,&local_a8);
        (pPVar3->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TestCase_00d2b0f0;
        tcu::TestNode::addChild(this_02,(TestNode *)pPVar3);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != &local_90._M_impl.super__Rb_tree_header);
    }
    tcu::TestNode::addChild(this_01,this_02);
    local_c0 = local_c0 + 1;
  } while (local_c0 != (AttPoint *)&TestBase::vtable);
  tcu::TestNode::addChild(pTVar2,this_00);
  tcu::TestNode::addChild(pTVar2,this_01);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&local_60);
  return (TestCaseGroup *)pTVar2;
}

Assistant:

TestCaseGroup* Context::createRenderableTests (void)
{
	TestCaseGroup* const renderableTests = new TestCaseGroup(
		m_testCtx, "renderable", "Tests for support of renderable image formats");

	TestCaseGroup* const rbRenderableTests = new TestCaseGroup(
		m_testCtx, "renderbuffer", "Tests for renderbuffer formats");

	TestCaseGroup* const texRenderableTests = new TestCaseGroup(
		m_testCtx, "texture", "Tests for texture formats");

	static const struct AttPoint {
		GLenum			attPoint;
		const char*		name;
		const char*		desc;
	} attPoints[] =
	{
		{ GL_COLOR_ATTACHMENT0,		"color0",	"Tests for color attachments"	},
		{ GL_STENCIL_ATTACHMENT,	"stencil",	"Tests for stencil attachments" },
		{ GL_DEPTH_ATTACHMENT,		"depth",	"Tests for depth attachments"	},
	};

	// At each attachment point, iterate through all the possible formats to
	// detect both false positives and false negatives.
	const Formats rboFmts = m_allFormats.getFormats(ANY_FORMAT);
	const Formats texFmts = m_allFormats.getFormats(ANY_FORMAT);

	for (const AttPoint* it = DE_ARRAY_BEGIN(attPoints); it != DE_ARRAY_END(attPoints); it++)
	{
		TestCaseGroup* const rbAttTests = new TestCaseGroup(m_testCtx, it->name, it->desc);
		TestCaseGroup* const texAttTests = new TestCaseGroup(m_testCtx, it->name, it->desc);

		for (Formats::const_iterator it2 = rboFmts.begin(); it2 != rboFmts.end(); it2++)
		{
			const RenderableParams params = { it->attPoint, GL_RENDERBUFFER, *it2 };
			rbAttTests->addChild(new RenderableTest(*this, params));
		}
		rbRenderableTests->addChild(rbAttTests);

		for (Formats::const_iterator it2 = texFmts.begin(); it2 != texFmts.end(); it2++)
		{
			const RenderableParams params = { it->attPoint, GL_TEXTURE, *it2 };
			texAttTests->addChild(new RenderableTest(*this, params));
		}
		texRenderableTests->addChild(texAttTests);
	}
	renderableTests->addChild(rbRenderableTests);
	renderableTests->addChild(texRenderableTests);

	return renderableTests;
}